

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::load_ffmpeg_external
          (CImgList<unsigned_char> *this,char *filename)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *pFVar5;
  size_t sVar6;
  CImg<char> *pCVar7;
  char *pcVar8;
  CImgList<unsigned_char> *pCVar9;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  ulong uVar10;
  CImg<unsigned_char> img;
  CImg<char> filename_tmp2;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<unsigned_char> local_d8;
  CImg<char> local_b8;
  char *local_98;
  CImg<char> local_90;
  CImg<char> local_70;
  CImg<char> local_50;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::load_ffmpeg_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar5 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar5 = fopen(filename,"rb");
  }
  if (pFVar5 != (FILE *)0x0) {
    if (((_stdin != pFVar5) && (_stdout != pFVar5)) && (uVar1 = fclose(pFVar5), uVar1 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar1);
    }
    CImg<char>::CImg(&local_70,0x400,1,1,1);
    CImg<char>::CImg(&local_90,0x100,1,1,1);
    local_98 = filename;
    CImg<char>::CImg(&local_b8,0x100,1,1,1);
    while( true ) {
      pcVar8 = local_90._data;
      uVar10 = (ulong)local_90._width;
      pcVar3 = cimg::temporary_path((char *)0x0,false);
      pcVar4 = cimg::filenamerand();
      snprintf(pcVar8,uVar10,"%s%c%s",pcVar3,0x2f,pcVar4);
      snprintf(local_b8._data,(ulong)local_b8._width,"%s_000001.ppm",local_90._data);
      pFVar5 = fopen(local_b8._data,"rb");
      if (pFVar5 == (FILE *)0x0) break;
      if (((_stdin != pFVar5) && (_stdout != pFVar5)) && (iVar2 = fclose(pFVar5), iVar2 != 0)) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
      }
    }
    snprintf(local_b8._data,(ulong)local_b8._width,"%s_%%6d.ppm",local_90._data);
    pcVar3 = local_70._data;
    pcVar4 = cimg::ffmpeg_path((char *)0x0,false);
    pcVar8 = local_98;
    sVar6 = strlen(local_98);
    CImg<char>::CImg((CImg<char> *)&local_d8,pcVar8,(int)sVar6 + 1,1,1,1,false);
    pCVar7 = CImg<char>::_system_strescape((CImg<char> *)&local_d8);
    pcVar8 = pCVar7->_data;
    CImg<char>::string(&local_50,local_b8._data,true,false);
    pCVar7 = CImg<char>::_system_strescape(&local_50);
    snprintf(pcVar3,(ulong)local_70._width,"%s -i \"%s\" \"%s\"",pcVar4,pcVar8,pCVar7->_data);
    if ((local_50._is_shared == false) && (local_50._data != (char *)0x0)) {
      operator_delete__(local_50._data);
    }
    if ((local_d8._is_shared == false) && (local_d8._data != (uchar *)0x0)) {
      operator_delete__(local_d8._data);
    }
    sVar6 = strlen(local_70._data);
    uVar10 = sVar6 & 0xffffffff;
    if (uVar10 != 0) {
      pcVar8 = (char *)operator_new__((ulong)((int)sVar6 + 0x18));
      memcpy(pcVar8,local_70._data,uVar10);
      builtin_strncpy(pcVar8 + uVar10," >/dev/null 2>&1",0x11);
      system(pcVar8);
      operator_delete__(pcVar8);
    }
    uVar10 = 1;
    cimg::exception_mode(0,true);
    assign(this);
    do {
      snprintf(local_b8._data,(ulong)local_b8._width,"%s_%.6u.ppm",local_90._data,uVar10);
      local_d8._data = (uchar *)0x0;
      local_d8._width = 0;
      local_d8._height = 0;
      local_d8._depth = 0;
      local_d8._spectrum = 0;
      local_d8._is_shared = false;
      CImg<unsigned_char>::_load_pnm(&local_d8,(FILE *)0x0,local_b8._data);
      if (local_d8._data != (uchar *)0x0) {
        uVar1 = this->_width;
        pCVar9 = insert(this,1,uVar1);
        CImg<unsigned_char>::move_to(&local_d8,pCVar9->_data + uVar1);
        remove(local_b8._data);
      }
      if ((local_d8._is_shared == false) && (local_d8._data != (uchar *)0x0)) {
        operator_delete__(local_d8._data);
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    } while( true );
  }
  this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
  CImgIOException::CImgIOException
            (this_01,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
  __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImgList<T>& load_ffmpeg_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimglist_instance
                                    "load_ffmpeg_external(): Specified filename is (null).",
                                    cimglist_instance);
      cimg::fclose(cimg::fopen(filename,"rb")); // Check if file exists
      CImg<charT> command(1024), filename_tmp(256), filename_tmp2(256);
      std::FILE *file = 0;
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_000001.ppm",filename_tmp._data);
        if ((file=cimg::std_fopen(filename_tmp2,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_%%6d.ppm",filename_tmp._data);
      cimg_snprintf(command,command._width,"%s -i \"%s\" \"%s\"",
                    cimg::ffmpeg_path(),
                    CImg<charT>::string(filename)._system_strescape().data(),
                    CImg<charT>::string(filename_tmp2)._system_strescape().data());
      cimg::system(command,0);
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      assign();
      unsigned int i = 1;
      for (bool stop_flag = false; !stop_flag; ++i) {
        cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_%.6u.ppm",filename_tmp._data,i);
        CImg<T> img;
        try { img.load_pnm(filename_tmp2); }
        catch (CImgException&) { stop_flag = true; }
        if (img) { img.move_to(*this); std::remove(filename_tmp2); }
      }
      cimg::exception_mode(omode);
      if (is_empty())
        throw CImgIOException(_cimglist_instance
                              "load_ffmpeg_external(): Failed to open file '%s' with external command 'ffmpeg'.",
                              cimglist_instance,
                              filename);
      return *this;
    }